

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ED.cpp
# Opt level: O0

void __thiscall ED::ED(ED *this,EDColor *obj)

{
  int iVar1;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  local_40;
  EDColor *local_18;
  EDColor *obj_local;
  ED *this_local;
  
  local_18 = obj;
  obj_local = (EDColor *)this;
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::vector(&this->segmentPoints);
  cv::Mat::Mat(&this->smoothImage);
  cv::Mat::Mat(&this->srcImage);
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector(&this->anchorPoints);
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector(&this->edgePoints);
  cv::Mat::Mat(&this->edgeImage);
  cv::Mat::Mat(&this->gradImage);
  iVar1 = EDColor::getWidth(local_18);
  this->width = iVar1;
  iVar1 = EDColor::getHeight(local_18);
  this->height = iVar1;
  EDColor::getSegments(&local_40,local_18);
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::operator=(&this->segmentPoints,&local_40);
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::~vector(&local_40);
  iVar1 = EDColor::getSegmentNo(local_18);
  this->segmentNos = iVar1;
  return;
}

Assistant:

ED::ED(EDColor &obj) 
{
	width = obj.getWidth();
	height = obj.getHeight();
	segmentPoints = obj.getSegments();
	segmentNos = obj.getSegmentNo();
}